

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_impl.cpp
# Opt level: O3

MPP_RET try_proc_processing_task(MppEncImpl *enc,EncAsyncWait *wait)

{
  void *hal;
  void *pvVar1;
  EncRcTask *task;
  MppPacket packet;
  pthread_mutex_t *__mutex;
  bool bVar2;
  MPP_RET MVar3;
  RK_U32 RVar4;
  uint *puVar5;
  char *fmt;
  mpp_list *pkt_out;
  undefined8 uVar6;
  HalEncTask *task_00;
  HalTaskHnd hnd;
  HalTaskHnd local_48;
  EncAsyncWait *local_40;
  MppPacket local_38;
  
  local_48 = (HalTaskHnd)0x0;
  MVar3 = hal_task_get_hnd(enc->tasks,1,&local_48);
  if (MVar3 != MPP_OK) {
    return MVar3;
  }
  local_40 = wait;
  puVar5 = (uint *)hal_task_hnd_get_data(local_48);
  if (((*(byte *)((long)puVar5 + 7) & 8) != 0) &&
     (_mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"!info->status.enc_done",
                 "try_proc_processing_task",0xc3d), (mpp_debug._3_1_ & 0x10) != 0)) {
    abort();
  }
  hal = enc->enc_hal;
  pvVar1 = enc->mpp;
  task_00 = (HalEncTask *)(puVar5 + 4);
  task = *(EncRcTask **)(puVar5 + 6);
  packet = *(MppPacket *)(puVar5 + 0x12);
  local_38 = packet;
  if ((puVar5[0x2d] == 0) && (*(int *)(*(long *)(puVar5 + 8) + 8) == 0)) {
    if (((byte)mpp_enc_debug & 0x20) != 0) {
      _mpp_log_l(4,"mpp_enc","task %d hal wait\n","enc_async_wait_task",
                 (ulong)*(ushort *)((long)puVar5 + 0x166));
    }
    MVar3 = mpp_enc_hal_wait(hal,task_00);
    if (MVar3 == MPP_OK) {
      mpp_stopwatch_record(*(MppStopwatch *)(puVar5 + 0x20),"encode hal finish");
      if (((byte)mpp_enc_debug & 0x20) != 0) {
        _mpp_log_l(4,"mpp_enc","task %d rc hal end\n","enc_async_wait_task",
                   (ulong)*(ushort *)((long)puVar5 + 0x166));
      }
      MVar3 = rc_hal_end(enc->rc_ctx,task);
      if (MVar3 == MPP_OK) {
        if (((byte)mpp_enc_debug & 0x20) != 0) {
          _mpp_log_l(4,"mpp_enc","task %d hal ret task\n","enc_async_wait_task",
                     (ulong)*(ushort *)((long)puVar5 + 0x166));
        }
        MVar3 = mpp_enc_hal_ret_task(hal,task_00);
        if (MVar3 == MPP_OK) {
          if (((byte)mpp_enc_debug & 0x20) != 0) {
            _mpp_log_l(4,"mpp_enc","task %d rc frame end\n","enc_async_wait_task",
                       (ulong)*(ushort *)((long)puVar5 + 0x166));
          }
          MVar3 = rc_frm_end(enc->rc_ctx,task);
          bVar2 = true;
          if (MVar3 == MPP_OK) goto LAB_00142e4e;
          fmt = "mpp %p rc_frm_end:%-4d failed return %d";
          uVar6 = 0xce2;
        }
        else {
          fmt = "mpp %p mpp_enc_hal_ret_task:%-4d failed return %d";
          uVar6 = 0xcdf;
        }
      }
      else {
        fmt = "mpp %p rc_hal_end:%-4d failed return %d";
        uVar6 = 0xcdc;
      }
    }
    else {
      fmt = "mpp %p mpp_enc_hal_wait:%-4d failed return %d";
      uVar6 = 0xcd7;
    }
    bVar2 = false;
    _mpp_log_l(2,"mpp_enc",fmt,(char *)0x0,pvVar1,uVar6,MVar3);
  }
  else {
    bVar2 = true;
  }
LAB_00142e4e:
  RVar4 = mpp_packet_is_partition(packet);
  if (RVar4 == 0) {
    mpp_packet_set_length(packet,(ulong)puVar5[0x19]);
    check_hal_task_pkt_len(*(HalEncTask **)(puVar5 + 0x12),(char *)(ulong)puVar5[0x19]);
  }
  if (((byte)mpp_enc_debug & 0x20) != 0) {
    _mpp_log_l(4,"mpp_enc","task %d output packet pts %lld\n","enc_async_wait_task",(ulong)*puVar5,
               *(undefined8 *)(puVar5 + 2));
  }
  if ((enc->enc_failed_drop == 0) || ((*(byte *)(*(long *)(puVar5 + 6) + 0x98) & 0x20) != 0)) {
    enc->enc_failed_drop = 0;
  }
  else {
    mpp_packet_set_length(packet,0);
    _mpp_log_l(2,"mpp_enc","last frame enc failed, drop this P frame\n","enc_async_wait_task");
    *(byte *)&(enc->frm_cfg).force_flag = (byte)(enc->frm_cfg).force_flag | 1;
    (enc->hdr_status).val = 0;
  }
  if (bVar2) {
    set_enc_info_to_packet(enc,task_00);
  }
  else {
    *(byte *)&(enc->frm_cfg).force_flag = (byte)(enc->frm_cfg).force_flag | 1;
    (enc->hdr_status).val = 0;
    mpp_packet_set_length(packet,0);
    enc->enc_failed_drop = 1;
    _mpp_log_l(2,"mpp_enc","enc failed force idr!\n","enc_async_wait_task");
  }
  __mutex = *(pthread_mutex_t **)((long)pvVar1 + 8);
  if (__mutex != (pthread_mutex_t *)0x0) {
    pthread_mutex_lock(__mutex);
    mpp_list::add_at_tail((mpp_list *)&__mutex->__data,&local_38,8);
    *(int *)((long)pvVar1 + 0x20) = *(int *)((long)pvVar1 + 0x20) + 1;
    pthread_cond_signal((pthread_cond_t *)(__mutex + 1));
    pthread_mutex_unlock(__mutex);
  }
  hal_task_hnd_set_status(local_48,0);
  *(byte *)local_40 = *(byte *)local_40 & 0xef;
  return MPP_OK;
}

Assistant:

static MPP_RET try_proc_processing_task(MppEncImpl *enc, EncAsyncWait *wait)
{
    HalTaskHnd hnd = NULL;
    EncAsyncTaskInfo *info = NULL;
    MPP_RET ret = MPP_NOK;

    ret = hal_task_get_hnd(enc->tasks, TASK_PROCESSING, &hnd);
    if (ret)
        return ret;

    info = (EncAsyncTaskInfo *)hal_task_hnd_get_data(hnd);

    mpp_assert(!info->status.enc_done);

    enc_async_wait_task(enc, info);
    hal_task_hnd_set_status(hnd, TASK_IDLE);
    wait->task_hnd = 0;

    return MPP_OK;
}